

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalFunction.cpp
# Opt level: O0

void __thiscall LocalFunction::LocalFunction(LocalFunction *this,Stream *stream)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ICommand *pIVar3;
  runtime_error *this_00;
  ulong uVar4;
  uint *puVar5;
  uint local_30;
  uint i;
  ICommand *block;
  Stream *stream_local;
  LocalFunction *this_local;
  
  uVar2 = (**stream->_vptr_Stream)();
  this->name = uVar2;
  pIVar3 = loadCommand(stream);
  uVar2 = (*pIVar3->_vptr_ICommand[1])();
  if ((uVar2 & 0xff) != 8) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Local function block must have type SCRIPT_BLOCK!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->code = pIVar3;
  uVar2 = (**stream->_vptr_Stream)();
  this->argsCount = uVar2;
  auVar1 = ZEXT416(this->argsCount) * ZEXT816(4);
  uVar4 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  puVar5 = (uint *)operator_new__(uVar4);
  this->args = puVar5;
  for (local_30 = 0; local_30 < this->argsCount; local_30 = local_30 + 1) {
    uVar2 = (**stream->_vptr_Stream)();
    this->args[local_30] = uVar2;
  }
  return;
}

Assistant:

LocalFunction::LocalFunction(Stream *stream) {
	this->name = stream->readInt();
	
	ICommand* block = loadCommand(stream);
	if (block->getType() != CT_SCRIPT_BLOCK) {
		throw std::runtime_error("Local function block must have type SCRIPT_BLOCK!");
	}
	this->code = block;
	
	this->argsCount = stream->readInt();
	unsigned int i;
	this->args = new unsigned int[this->argsCount];
	for (i = 0; i < this->argsCount; i++) {
		this->args[i] = stream->readInt();
	}
}